

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O1

void av1_gen_inv_stage_range
               (int8_t *stage_range_col,int8_t *stage_range_row,TXFM_2D_FLIP_CFG *cfg,
               TX_SIZE tx_size,int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  ulong uVar3;
  
  iVar1 = '\x10';
  if (bd == 8) {
    iVar2 = '\x10';
  }
  else if (bd == 10) {
    iVar2 = '\x12';
  }
  else {
    iVar2 = '\x14';
    iVar1 = '\x12';
  }
  if (0 < cfg->stage_num_row) {
    uVar3 = 0;
    do {
      stage_range_row[uVar3] = iVar2;
      if (10 < uVar3) break;
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)cfg->stage_num_row);
  }
  if (0 < cfg->stage_num_col) {
    uVar3 = 0;
    do {
      stage_range_col[uVar3] = iVar1;
      if (10 < uVar3) {
        return;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)cfg->stage_num_col);
  }
  return;
}

Assistant:

void av1_gen_inv_stage_range(int8_t *stage_range_col, int8_t *stage_range_row,
                             const TXFM_2D_FLIP_CFG *cfg, TX_SIZE tx_size,
                             int bd) {
  const int fwd_shift = inv_start_range[tx_size];
  const int8_t *shift = cfg->shift;
  int8_t opt_range_row, opt_range_col;
  if (bd == 8) {
    opt_range_row = 16;
    opt_range_col = 16;
  } else if (bd == 10) {
    opt_range_row = 18;
    opt_range_col = 16;
  } else {
    assert(bd == 12);
    opt_range_row = 20;
    opt_range_col = 18;
  }
  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_row && i < MAX_TXFM_STAGE_NUM; ++i) {
    int real_range_row = cfg->stage_range_row[i] + fwd_shift + bd + 1;
    (void)real_range_row;
    if (cfg->txfm_type_row == TXFM_TYPE_ADST4 && i == 1) {
      // the adst4 may use 1 extra bit on top of opt_range_row at stage 1
      // so opt_range_row >= real_range_row will not hold
      stage_range_row[i] = opt_range_row;
    } else {
      assert(opt_range_row >= real_range_row);
      stage_range_row[i] = opt_range_row;
    }
  }
  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_col && i < MAX_TXFM_STAGE_NUM; ++i) {
    int real_range_col =
        cfg->stage_range_col[i] + fwd_shift + shift[0] + bd + 1;
    (void)real_range_col;
    if (cfg->txfm_type_col == TXFM_TYPE_ADST4 && i == 1) {
      // the adst4 may use 1 extra bit on top of opt_range_col at stage 1
      // so opt_range_col >= real_range_col will not hold
      stage_range_col[i] = opt_range_col;
    } else {
      assert(opt_range_col >= real_range_col);
      stage_range_col[i] = opt_range_col;
    }
  }
}